

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::DiscreteSpectrum
          (DiscreteSpectrum *this,double chain,array<double,_2UL> *energy,
          array<double,_2UL> *intensity,double type,array<double,_2UL> *ris,array<double,_2UL> *ricc
          ,array<double,_2UL> *rick,array<double,_2UL> *ricl)

{
  vector<double,_std::allocator<double>_> local_88;
  double local_68;
  double dStack_60;
  undefined1 local_58 [48];
  pointer local_28;
  pointer local_20;
  pointer local_18;
  
  local_68 = energy->_M_elems[0];
  dStack_60 = energy->_M_elems[1];
  generateList(&local_88,chain,type,intensity,ris,ricc,rick,ricl);
  local_58._8_8_ =
       (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_58._0_8_ = 0;
  local_58._16_8_ = 0;
  local_58._24_8_ = 0;
  local_58._40_4_ = SUB84(local_68,0);
  local_58._32_8_ = dStack_60;
  local_58._44_4_ = (int)((ulong)local_68 >> 0x20);
  local_28 = local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_20 = local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_18 = local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  DiscreteSpectrum(this,(ListRecord *)local_58);
  if (local_28 != (pointer)0x0) {
    operator_delete(local_28,(long)local_18 - (long)local_28);
  }
  if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

DiscreteSpectrum( double chain,
                  const std::array< double, 2 >& energy,
                  const std::array< double, 2 >& intensity,
                  double type,
                  const std::array< double, 2 >& ris,
                  const std::array< double, 2 >& ricc,
                  const std::array< double, 2 >& rick,
                  const std::array< double, 2 >& ricl ) :
  // this can never fail, try-catch would be unreachable
  DiscreteSpectrum(
        ListRecord( energy[0], energy[1], 0, 0, 0,
                    generateList( chain, type,
                                  intensity,
                                  ris, ricc, rick, ricl ) ) ) {}